

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16781328,_false,_embree::sse42::VirtualCurveIntersectorK<4>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  int iVar14;
  float fVar15;
  uint uVar16;
  int iVar17;
  size_t sVar18;
  undefined8 uVar19;
  long lVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar25;
  int iVar26;
  AABBNodeMB4D *node1;
  ulong uVar27;
  uint uVar28;
  ulong uVar29;
  undefined4 uVar30;
  ulong unaff_RBP;
  undefined4 uVar31;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar32;
  size_t sVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  float fVar48;
  float fVar49;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar50;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  vint4 bi;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar59;
  float fVar60;
  float fVar61;
  float fVar69;
  float fVar71;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar70;
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar68;
  float fVar82;
  float fVar83;
  vint4 ai_3;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar84;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar90;
  vint4 bi_1;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  vint4 ai;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  vint4 ai_1;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar111 [16];
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  vfloat<4> tNear;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar32 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar5 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar6 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar7 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar8 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fVar9 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar10 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar11 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar12 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar13 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar14 = (tray->tnear).field_0.i[k];
  iVar51 = (tray->tfar).field_0.i[k];
  iVar52 = iVar51;
  iVar53 = iVar51;
  iVar54 = iVar51;
  while (pSVar32 != stack) {
    pSVar25 = pSVar32 + -1;
    pSVar32 = pSVar32 + -1;
    if ((float)pSVar25->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar25->dist == *(float *)(ray + k * 4 + 0x80)) {
      sVar33 = (pSVar32->ptr).ptr;
      do {
        if ((sVar33 & 8) == 0) {
          fVar15 = *(float *)(ray + k * 4 + 0x70);
          uVar28 = (uint)sVar33 & 7;
          uVar27 = sVar33 & 0xfffffffffffffff0;
          uVar31 = (undefined4)(unaff_RBP >> 0x20);
          if (uVar28 == 3) {
            fVar96 = 1.0 - fVar15;
            fVar97 = fVar96 * 0.0;
            auVar79._0_4_ =
                 fVar8 * *(float *)(uVar27 + 0x20) +
                 fVar9 * *(float *)(uVar27 + 0x50) + fVar10 * *(float *)(uVar27 + 0x80);
            auVar79._4_4_ =
                 fVar8 * *(float *)(uVar27 + 0x24) +
                 fVar9 * *(float *)(uVar27 + 0x54) + fVar10 * *(float *)(uVar27 + 0x84);
            auVar79._8_4_ =
                 fVar8 * *(float *)(uVar27 + 0x28) +
                 fVar9 * *(float *)(uVar27 + 0x58) + fVar10 * *(float *)(uVar27 + 0x88);
            auVar79._12_4_ =
                 fVar8 * *(float *)(uVar27 + 0x2c) +
                 fVar9 * *(float *)(uVar27 + 0x5c) + fVar10 * *(float *)(uVar27 + 0x8c);
            auVar86._0_4_ =
                 fVar8 * *(float *)(uVar27 + 0x30) +
                 fVar9 * *(float *)(uVar27 + 0x60) + fVar10 * *(float *)(uVar27 + 0x90);
            auVar86._4_4_ =
                 fVar8 * *(float *)(uVar27 + 0x34) +
                 fVar9 * *(float *)(uVar27 + 100) + fVar10 * *(float *)(uVar27 + 0x94);
            auVar86._8_4_ =
                 fVar8 * *(float *)(uVar27 + 0x38) +
                 fVar9 * *(float *)(uVar27 + 0x68) + fVar10 * *(float *)(uVar27 + 0x98);
            auVar86._12_4_ =
                 fVar8 * *(float *)(uVar27 + 0x3c) +
                 fVar9 * *(float *)(uVar27 + 0x6c) + fVar10 * *(float *)(uVar27 + 0x9c);
            fVar101 = (float)DAT_01ff1d40;
            fVar102 = DAT_01ff1d40._4_4_;
            fVar103 = DAT_01ff1d40._8_4_;
            fVar104 = DAT_01ff1d40._12_4_;
            auVar78._4_4_ = -(uint)(ABS(auVar79._4_4_) < fVar102);
            auVar78._0_4_ = -(uint)(ABS(auVar79._0_4_) < fVar101);
            auVar78._8_4_ = -(uint)(ABS(auVar79._8_4_) < fVar103);
            auVar78._12_4_ = -(uint)(ABS(auVar79._12_4_) < fVar104);
            auVar95 = blendvps(auVar79,_DAT_01ff1d40,auVar78);
            auVar92._4_4_ = -(uint)(ABS(auVar86._4_4_) < fVar102);
            auVar92._0_4_ = -(uint)(ABS(auVar86._0_4_) < fVar101);
            auVar92._8_4_ = -(uint)(ABS(auVar86._8_4_) < fVar103);
            auVar92._12_4_ = -(uint)(ABS(auVar86._12_4_) < fVar104);
            auVar92 = blendvps(auVar86,_DAT_01ff1d40,auVar92);
            local_1068 = (float)*(undefined8 *)(uVar27 + 0xa0);
            fStack_1064 = (float)((ulong)*(undefined8 *)(uVar27 + 0xa0) >> 0x20);
            fStack_1060 = (float)*(undefined8 *)(uVar27 + 0xa8);
            fStack_105c = (float)((ulong)*(undefined8 *)(uVar27 + 0xa8) >> 0x20);
            local_10c8 = (float)*(undefined8 *)(uVar27 + 0x70);
            fStack_10c4 = (float)((ulong)*(undefined8 *)(uVar27 + 0x70) >> 0x20);
            fStack_10c0 = (float)*(undefined8 *)(uVar27 + 0x78);
            fStack_10bc = (float)((ulong)*(undefined8 *)(uVar27 + 0x78) >> 0x20);
            auVar64._0_4_ =
                 fVar8 * *(float *)(uVar27 + 0x40) + fVar9 * local_10c8 + fVar10 * local_1068;
            auVar64._4_4_ =
                 fVar8 * *(float *)(uVar27 + 0x44) + fVar9 * fStack_10c4 + fVar10 * fStack_1064;
            auVar64._8_4_ =
                 fVar8 * *(float *)(uVar27 + 0x48) + fVar9 * fStack_10c0 + fVar10 * fStack_1060;
            auVar64._12_4_ =
                 fVar8 * *(float *)(uVar27 + 0x4c) + fVar9 * fStack_10bc + fVar10 * fStack_105c;
            auVar89._4_4_ = -(uint)(ABS(auVar64._4_4_) < fVar102);
            auVar89._0_4_ = -(uint)(ABS(auVar64._0_4_) < fVar101);
            auVar89._8_4_ = -(uint)(ABS(auVar64._8_4_) < fVar103);
            auVar89._12_4_ = -(uint)(ABS(auVar64._12_4_) < fVar104);
            auVar78 = blendvps(auVar64,_DAT_01ff1d40,auVar89);
            auVar63 = rcpps(auVar89,auVar95);
            fVar101 = auVar63._0_4_;
            fVar104 = auVar63._4_4_;
            fVar109 = auVar63._8_4_;
            fVar110 = auVar63._12_4_;
            fVar101 = (1.0 - auVar95._0_4_ * fVar101) * fVar101 + fVar101;
            fVar104 = (1.0 - auVar95._4_4_ * fVar104) * fVar104 + fVar104;
            fVar109 = (1.0 - auVar95._8_4_ * fVar109) * fVar109 + fVar109;
            fVar110 = (1.0 - auVar95._12_4_ * fVar110) * fVar110 + fVar110;
            auVar63 = rcpps(auVar63,auVar92);
            fVar102 = auVar63._0_4_;
            auVar87._0_4_ = auVar92._0_4_ * fVar102;
            fVar82 = auVar63._4_4_;
            auVar87._4_4_ = auVar92._4_4_ * fVar82;
            fVar83 = auVar63._8_4_;
            auVar87._8_4_ = auVar92._8_4_ * fVar83;
            fVar84 = auVar63._12_4_;
            auVar87._12_4_ = auVar92._12_4_ * fVar84;
            fVar102 = (1.0 - auVar87._0_4_) * fVar102 + fVar102;
            fVar82 = (1.0 - auVar87._4_4_) * fVar82 + fVar82;
            fVar83 = (1.0 - auVar87._8_4_) * fVar83 + fVar83;
            fVar84 = (1.0 - auVar87._12_4_) * fVar84 + fVar84;
            auVar63 = rcpps(auVar87,auVar78);
            fVar103 = auVar63._0_4_;
            fVar48 = auVar63._4_4_;
            fVar49 = auVar63._8_4_;
            fVar50 = auVar63._12_4_;
            fVar103 = (1.0 - auVar78._0_4_ * fVar103) * fVar103 + fVar103;
            fVar48 = (1.0 - auVar78._4_4_ * fVar48) * fVar48 + fVar48;
            fVar49 = (1.0 - auVar78._8_4_ * fVar49) * fVar49 + fVar49;
            fVar50 = (1.0 - auVar78._12_4_ * fVar50) * fVar50 + fVar50;
            fVar60 = *(float *)(uVar27 + 0x20) * fVar5 +
                     *(float *)(uVar27 + 0x50) * fVar6 +
                     *(float *)(uVar27 + 0x80) * fVar7 + *(float *)(uVar27 + 0xb0);
            fVar69 = *(float *)(uVar27 + 0x24) * fVar5 +
                     *(float *)(uVar27 + 0x54) * fVar6 +
                     *(float *)(uVar27 + 0x84) * fVar7 + *(float *)(uVar27 + 0xb4);
            fVar71 = *(float *)(uVar27 + 0x28) * fVar5 +
                     *(float *)(uVar27 + 0x58) * fVar6 +
                     *(float *)(uVar27 + 0x88) * fVar7 + *(float *)(uVar27 + 0xb8);
            fVar73 = *(float *)(uVar27 + 0x2c) * fVar5 +
                     *(float *)(uVar27 + 0x5c) * fVar6 +
                     *(float *)(uVar27 + 0x8c) * fVar7 + *(float *)(uVar27 + 0xbc);
            fVar61 = *(float *)(uVar27 + 0x30) * fVar5 +
                     *(float *)(uVar27 + 0x60) * fVar6 +
                     *(float *)(uVar27 + 0x90) * fVar7 + *(float *)(uVar27 + 0xc0);
            fVar70 = *(float *)(uVar27 + 0x34) * fVar5 +
                     *(float *)(uVar27 + 100) * fVar6 +
                     *(float *)(uVar27 + 0x94) * fVar7 + *(float *)(uVar27 + 0xc4);
            fVar72 = *(float *)(uVar27 + 0x38) * fVar5 +
                     *(float *)(uVar27 + 0x68) * fVar6 +
                     *(float *)(uVar27 + 0x98) * fVar7 + *(float *)(uVar27 + 200);
            fVar74 = *(float *)(uVar27 + 0x3c) * fVar5 +
                     *(float *)(uVar27 + 0x6c) * fVar6 +
                     *(float *)(uVar27 + 0x9c) * fVar7 + *(float *)(uVar27 + 0xcc);
            fVar112 = *(float *)(uVar27 + 0x40) * fVar5 +
                      local_10c8 * fVar6 + local_1068 * fVar7 + *(float *)(uVar27 + 0xd0);
            fVar113 = *(float *)(uVar27 + 0x44) * fVar5 +
                      fStack_10c4 * fVar6 + fStack_1064 * fVar7 + *(float *)(uVar27 + 0xd4);
            fVar114 = *(float *)(uVar27 + 0x48) * fVar5 +
                      fStack_10c0 * fVar6 + fStack_1060 * fVar7 + *(float *)(uVar27 + 0xd8);
            fVar115 = *(float *)(uVar27 + 0x4c) * fVar5 +
                      fStack_10bc * fVar6 + fStack_105c * fVar7 + *(float *)(uVar27 + 0xdc);
            auVar63._4_4_ = iVar14;
            auVar63._0_4_ = iVar14;
            auVar63._8_4_ = iVar14;
            auVar63._12_4_ = iVar14;
            fVar105 = ((*(float *)(uVar27 + 0xe0) * fVar15 + fVar97) - fVar60) * fVar101;
            fVar106 = ((*(float *)(uVar27 + 0xe4) * fVar15 + fVar97) - fVar69) * fVar104;
            fVar107 = ((*(float *)(uVar27 + 0xe8) * fVar15 + fVar97) - fVar71) * fVar109;
            fVar108 = ((*(float *)(uVar27 + 0xec) * fVar15 + fVar97) - fVar73) * fVar110;
            fVar101 = ((*(float *)(uVar27 + 0x110) * fVar15 + fVar96) - fVar60) * fVar101;
            fVar104 = ((*(float *)(uVar27 + 0x114) * fVar15 + fVar96) - fVar69) * fVar104;
            fVar109 = ((*(float *)(uVar27 + 0x118) * fVar15 + fVar96) - fVar71) * fVar109;
            fVar110 = ((*(float *)(uVar27 + 0x11c) * fVar15 + fVar96) - fVar73) * fVar110;
            fVar60 = ((*(float *)(uVar27 + 0xf0) * fVar15 + fVar97) - fVar61) * fVar102;
            fVar69 = ((*(float *)(uVar27 + 0xf4) * fVar15 + fVar97) - fVar70) * fVar82;
            fVar71 = ((*(float *)(uVar27 + 0xf8) * fVar15 + fVar97) - fVar72) * fVar83;
            fVar73 = ((*(float *)(uVar27 + 0xfc) * fVar15 + fVar97) - fVar74) * fVar84;
            fVar98 = ((fVar97 + *(float *)(uVar27 + 0x100) * fVar15) - fVar112) * fVar103;
            fVar99 = ((fVar97 + *(float *)(uVar27 + 0x104) * fVar15) - fVar113) * fVar48;
            fVar100 = ((fVar97 + *(float *)(uVar27 + 0x108) * fVar15) - fVar114) * fVar49;
            fVar97 = ((fVar97 + *(float *)(uVar27 + 0x10c) * fVar15) - fVar115) * fVar50;
            fVar102 = ((*(float *)(uVar27 + 0x120) * fVar15 + fVar96) - fVar61) * fVar102;
            fVar82 = ((*(float *)(uVar27 + 0x124) * fVar15 + fVar96) - fVar70) * fVar82;
            fVar83 = ((*(float *)(uVar27 + 0x128) * fVar15 + fVar96) - fVar72) * fVar83;
            fVar84 = ((*(float *)(uVar27 + 300) * fVar15 + fVar96) - fVar74) * fVar84;
            fVar103 = ((fVar15 * *(float *)(uVar27 + 0x130) + fVar96) - fVar112) * fVar103;
            fVar48 = ((fVar15 * *(float *)(uVar27 + 0x134) + fVar96) - fVar113) * fVar48;
            fVar49 = ((fVar15 * *(float *)(uVar27 + 0x138) + fVar96) - fVar114) * fVar49;
            fVar50 = ((fVar15 * *(float *)(uVar27 + 0x13c) + fVar96) - fVar115) * fVar50;
            auVar95._0_4_ =
                 (uint)((int)fVar102 < (int)fVar60) * (int)fVar102 |
                 (uint)((int)fVar102 >= (int)fVar60) * (int)fVar60;
            auVar95._4_4_ =
                 (uint)((int)fVar82 < (int)fVar69) * (int)fVar82 |
                 (uint)((int)fVar82 >= (int)fVar69) * (int)fVar69;
            auVar95._8_4_ =
                 (uint)((int)fVar83 < (int)fVar71) * (int)fVar83 |
                 (uint)((int)fVar83 >= (int)fVar71) * (int)fVar71;
            auVar95._12_4_ =
                 (uint)((int)fVar84 < (int)fVar73) * (int)fVar84 |
                 (uint)((int)fVar84 >= (int)fVar73) * (int)fVar73;
            auVar65._0_4_ =
                 (uint)((int)fVar103 < (int)fVar98) * (int)fVar103 |
                 (uint)((int)fVar103 >= (int)fVar98) * (int)fVar98;
            auVar65._4_4_ =
                 (uint)((int)fVar48 < (int)fVar99) * (int)fVar48 |
                 (uint)((int)fVar48 >= (int)fVar99) * (int)fVar99;
            auVar65._8_4_ =
                 (uint)((int)fVar49 < (int)fVar100) * (int)fVar49 |
                 (uint)((int)fVar49 >= (int)fVar100) * (int)fVar100;
            auVar65._12_4_ =
                 (uint)((int)fVar50 < (int)fVar97) * (int)fVar50 |
                 (uint)((int)fVar50 >= (int)fVar97) * (int)fVar97;
            auVar78 = maxps(auVar95,auVar65);
            auVar66._0_4_ =
                 (uint)((int)fVar101 < (int)fVar105) * (int)fVar101 |
                 (uint)((int)fVar101 >= (int)fVar105) * (int)fVar105;
            auVar66._4_4_ =
                 (uint)((int)fVar104 < (int)fVar106) * (int)fVar104 |
                 (uint)((int)fVar104 >= (int)fVar106) * (int)fVar106;
            auVar66._8_4_ =
                 (uint)((int)fVar109 < (int)fVar107) * (int)fVar109 |
                 (uint)((int)fVar109 >= (int)fVar107) * (int)fVar107;
            auVar66._12_4_ =
                 (uint)((int)fVar110 < (int)fVar108) * (int)fVar110 |
                 (uint)((int)fVar110 >= (int)fVar108) * (int)fVar108;
            auVar93._0_4_ =
                 (uint)((int)fVar101 < (int)fVar105) * (int)fVar105 |
                 (uint)((int)fVar101 >= (int)fVar105) * (int)fVar101;
            auVar93._4_4_ =
                 (uint)((int)fVar104 < (int)fVar106) * (int)fVar106 |
                 (uint)((int)fVar104 >= (int)fVar106) * (int)fVar104;
            auVar93._8_4_ =
                 (uint)((int)fVar109 < (int)fVar107) * (int)fVar107 |
                 (uint)((int)fVar109 >= (int)fVar107) * (int)fVar109;
            auVar93._12_4_ =
                 (uint)((int)fVar110 < (int)fVar108) * (int)fVar108 |
                 (uint)((int)fVar110 >= (int)fVar108) * (int)fVar110;
            auVar111._0_4_ =
                 (uint)((int)fVar102 < (int)fVar60) * (int)fVar60 |
                 (uint)((int)fVar102 >= (int)fVar60) * (int)fVar102;
            auVar111._4_4_ =
                 (uint)((int)fVar82 < (int)fVar69) * (int)fVar69 |
                 (uint)((int)fVar82 >= (int)fVar69) * (int)fVar82;
            auVar111._8_4_ =
                 (uint)((int)fVar83 < (int)fVar71) * (int)fVar71 |
                 (uint)((int)fVar83 >= (int)fVar71) * (int)fVar83;
            auVar111._12_4_ =
                 (uint)((int)fVar84 < (int)fVar73) * (int)fVar73 |
                 (uint)((int)fVar84 >= (int)fVar73) * (int)fVar84;
            auVar56._0_4_ =
                 (uint)((int)fVar103 < (int)fVar98) * (int)fVar98 |
                 (uint)((int)fVar103 >= (int)fVar98) * (int)fVar103;
            auVar56._4_4_ =
                 (uint)((int)fVar48 < (int)fVar99) * (int)fVar99 |
                 (uint)((int)fVar48 >= (int)fVar99) * (int)fVar48;
            auVar56._8_4_ =
                 (uint)((int)fVar49 < (int)fVar100) * (int)fVar100 |
                 (uint)((int)fVar49 >= (int)fVar100) * (int)fVar49;
            auVar56._12_4_ =
                 (uint)((int)fVar50 < (int)fVar97) * (int)fVar97 |
                 (uint)((int)fVar50 >= (int)fVar97) * (int)fVar50;
            auVar92 = minps(auVar111,auVar56);
            auVar63 = maxps(auVar63,auVar66);
            tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar63,auVar78);
            auVar39._4_4_ = iVar52;
            auVar39._0_4_ = iVar51;
            auVar39._8_4_ = iVar53;
            auVar39._12_4_ = iVar54;
            auVar63 = minps(auVar39,auVar93);
            auVar63 = minps(auVar63,auVar92);
            auVar57._4_4_ = -(uint)(tNear.field_0._4_4_ <= auVar63._4_4_);
            auVar57._0_4_ = -(uint)(tNear.field_0._0_4_ <= auVar63._0_4_);
            auVar57._8_4_ = -(uint)(tNear.field_0._8_4_ <= auVar63._8_4_);
            auVar57._12_4_ = -(uint)(tNear.field_0._12_4_ <= auVar63._12_4_);
            uVar30 = movmskps((int)unaff_RBP,auVar57);
            unaff_RBP = CONCAT44(uVar31,uVar30);
          }
          else {
            pfVar3 = (float *)(uVar27 + 0x80 + uVar35);
            pfVar1 = (float *)(uVar27 + 0x20 + uVar35);
            pfVar4 = (float *)(uVar27 + 0x80 + uVar29);
            pfVar2 = (float *)(uVar27 + 0x20 + uVar29);
            auVar37._0_4_ = ((*pfVar3 * fVar15 + *pfVar1) - fVar5) * fVar11;
            auVar37._4_4_ = ((pfVar3[1] * fVar15 + pfVar1[1]) - fVar5) * fVar11;
            auVar37._8_4_ = ((pfVar3[2] * fVar15 + pfVar1[2]) - fVar5) * fVar11;
            auVar37._12_4_ = ((pfVar3[3] * fVar15 + pfVar1[3]) - fVar5) * fVar11;
            auVar62._0_4_ = ((*pfVar4 * fVar15 + *pfVar2) - fVar6) * fVar12;
            auVar62._4_4_ = ((pfVar4[1] * fVar15 + pfVar2[1]) - fVar6) * fVar12;
            auVar62._8_4_ = ((pfVar4[2] * fVar15 + pfVar2[2]) - fVar6) * fVar12;
            auVar62._12_4_ = ((pfVar4[3] * fVar15 + pfVar2[3]) - fVar6) * fVar12;
            pfVar2 = (float *)(uVar27 + 0x80 + uVar36);
            pfVar1 = (float *)(uVar27 + 0x20 + uVar36);
            auVar75._0_4_ = ((*pfVar2 * fVar15 + *pfVar1) - fVar7) * fVar13;
            auVar75._4_4_ = ((pfVar2[1] * fVar15 + pfVar1[1]) - fVar7) * fVar13;
            auVar75._8_4_ = ((pfVar2[2] * fVar15 + pfVar1[2]) - fVar7) * fVar13;
            auVar75._12_4_ = ((pfVar2[3] * fVar15 + pfVar1[3]) - fVar7) * fVar13;
            auVar63 = maxps(auVar62,auVar75);
            pfVar2 = (float *)(uVar27 + 0x80 + (uVar35 ^ 0x10));
            pfVar1 = (float *)(uVar27 + 0x20 + (uVar35 ^ 0x10));
            auVar85._0_4_ = ((*pfVar2 * fVar15 + *pfVar1) - fVar5) * fVar11;
            auVar85._4_4_ = ((pfVar2[1] * fVar15 + pfVar1[1]) - fVar5) * fVar11;
            auVar85._8_4_ = ((pfVar2[2] * fVar15 + pfVar1[2]) - fVar5) * fVar11;
            auVar85._12_4_ = ((pfVar2[3] * fVar15 + pfVar1[3]) - fVar5) * fVar11;
            pfVar2 = (float *)(uVar27 + 0x80 + (uVar29 ^ 0x10));
            pfVar1 = (float *)(uVar27 + 0x20 + (uVar29 ^ 0x10));
            auVar91._0_4_ = ((*pfVar2 * fVar15 + *pfVar1) - fVar6) * fVar12;
            auVar91._4_4_ = ((pfVar2[1] * fVar15 + pfVar1[1]) - fVar6) * fVar12;
            auVar91._8_4_ = ((pfVar2[2] * fVar15 + pfVar1[2]) - fVar6) * fVar12;
            auVar91._12_4_ = ((pfVar2[3] * fVar15 + pfVar1[3]) - fVar6) * fVar12;
            pfVar2 = (float *)(uVar27 + 0x80 + (uVar36 ^ 0x10));
            pfVar1 = (float *)(uVar27 + 0x20 + (uVar36 ^ 0x10));
            auVar76._0_4_ = ((*pfVar2 * fVar15 + *pfVar1) - fVar7) * fVar13;
            auVar76._4_4_ = ((pfVar2[1] * fVar15 + pfVar1[1]) - fVar7) * fVar13;
            auVar76._8_4_ = ((pfVar2[2] * fVar15 + pfVar1[2]) - fVar7) * fVar13;
            auVar76._12_4_ = ((pfVar2[3] * fVar15 + pfVar1[3]) - fVar7) * fVar13;
            auVar92 = minps(auVar91,auVar76);
            auVar77._4_4_ = iVar14;
            auVar77._0_4_ = iVar14;
            auVar77._8_4_ = iVar14;
            auVar77._12_4_ = iVar14;
            auVar78 = maxps(auVar77,auVar37);
            tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar78,auVar63);
            auVar38._4_4_ = iVar52;
            auVar38._0_4_ = iVar51;
            auVar38._8_4_ = iVar53;
            auVar38._12_4_ = iVar54;
            auVar63 = minps(auVar38,auVar85);
            auVar63 = minps(auVar63,auVar92);
            if (uVar28 == 6) {
              bVar21 = (fVar15 < *(float *)(uVar27 + 0xf0) && *(float *)(uVar27 + 0xe0) <= fVar15)
                       && tNear.field_0._0_4_ <= auVar63._0_4_;
              bVar22 = (fVar15 < *(float *)(uVar27 + 0xf4) && *(float *)(uVar27 + 0xe4) <= fVar15)
                       && tNear.field_0._4_4_ <= auVar63._4_4_;
              bVar23 = (fVar15 < *(float *)(uVar27 + 0xf8) && *(float *)(uVar27 + 0xe8) <= fVar15)
                       && tNear.field_0._8_4_ <= auVar63._8_4_;
              bVar24 = (fVar15 < *(float *)(uVar27 + 0xfc) && *(float *)(uVar27 + 0xec) <= fVar15)
                       && tNear.field_0._12_4_ <= auVar63._12_4_;
            }
            else {
              bVar21 = tNear.field_0._0_4_ <= auVar63._0_4_;
              bVar22 = tNear.field_0._4_4_ <= auVar63._4_4_;
              bVar23 = tNear.field_0._8_4_ <= auVar63._8_4_;
              bVar24 = tNear.field_0._12_4_ <= auVar63._12_4_;
            }
            auVar55._0_4_ = (uint)bVar21 * -0x80000000;
            auVar55._4_4_ = (uint)bVar22 * -0x80000000;
            auVar55._8_4_ = (uint)bVar23 * -0x80000000;
            auVar55._12_4_ = (uint)bVar24 * -0x80000000;
            uVar30 = movmskps((int)unaff_RBP,auVar55);
            unaff_RBP = CONCAT44(uVar31,uVar30);
          }
        }
        if ((sVar33 & 8) == 0) {
          if (unaff_RBP == 0) {
            iVar26 = 4;
          }
          else {
            uVar27 = sVar33 & 0xfffffffffffffff0;
            lVar20 = 0;
            if (unaff_RBP != 0) {
              for (; (unaff_RBP >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
              }
            }
            iVar26 = 0;
            sVar33 = *(size_t *)(uVar27 + lVar20 * 8);
            uVar34 = unaff_RBP - 1 & unaff_RBP;
            if (uVar34 != 0) {
              uVar28 = tNear.field_0.i[lVar20];
              lVar20 = 0;
              if (uVar34 != 0) {
                for (; (uVar34 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
                }
              }
              sVar18 = *(size_t *)(uVar27 + lVar20 * 8);
              uVar16 = tNear.field_0.i[lVar20];
              uVar34 = uVar34 - 1 & uVar34;
              if (uVar34 == 0) {
                if (uVar28 < uVar16) {
                  (pSVar32->ptr).ptr = sVar18;
                  pSVar32->dist = uVar16;
                  pSVar32 = pSVar32 + 1;
                }
                else {
                  (pSVar32->ptr).ptr = sVar33;
                  pSVar32->dist = uVar28;
                  pSVar32 = pSVar32 + 1;
                  sVar33 = sVar18;
                }
              }
              else {
                auVar58._8_4_ = uVar28;
                auVar58._0_8_ = sVar33;
                auVar58._12_4_ = 0;
                auVar80._8_4_ = uVar16;
                auVar80._0_8_ = sVar18;
                auVar80._12_4_ = 0;
                lVar20 = 0;
                if (uVar34 != 0) {
                  for (; (uVar34 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
                  }
                }
                uVar19 = *(undefined8 *)(uVar27 + lVar20 * 8);
                iVar17 = tNear.field_0.i[lVar20];
                auVar67._8_4_ = iVar17;
                auVar67._0_8_ = uVar19;
                auVar67._12_4_ = 0;
                auVar40._8_4_ = -(uint)((int)uVar28 < (int)uVar16);
                uVar34 = uVar34 - 1 & uVar34;
                if (uVar34 == 0) {
                  auVar40._4_4_ = auVar40._8_4_;
                  auVar40._0_4_ = auVar40._8_4_;
                  auVar40._12_4_ = auVar40._8_4_;
                  auVar88._8_4_ = uVar16;
                  auVar88._0_8_ = sVar18;
                  auVar88._12_4_ = 0;
                  auVar92 = blendvps(auVar88,auVar58,auVar40);
                  auVar63 = blendvps(auVar58,auVar80,auVar40);
                  auVar41._8_4_ = -(uint)(auVar92._8_4_ < iVar17);
                  auVar41._4_4_ = auVar41._8_4_;
                  auVar41._0_4_ = auVar41._8_4_;
                  auVar41._12_4_ = auVar41._8_4_;
                  auVar81._8_4_ = iVar17;
                  auVar81._0_8_ = uVar19;
                  auVar81._12_4_ = 0;
                  auVar78 = blendvps(auVar81,auVar92,auVar41);
                  auVar92 = blendvps(auVar92,auVar67,auVar41);
                  auVar42._8_4_ = -(uint)(auVar63._8_4_ < auVar92._8_4_);
                  auVar42._4_4_ = auVar42._8_4_;
                  auVar42._0_4_ = auVar42._8_4_;
                  auVar42._12_4_ = auVar42._8_4_;
                  SVar68 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar92,auVar63,auVar42);
                  SVar59 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar63,auVar92,auVar42);
                  *pSVar32 = SVar59;
                  pSVar32[1] = SVar68;
                  sVar33 = auVar78._0_8_;
                  pSVar32 = pSVar32 + 2;
                }
                else {
                  lVar20 = 0;
                  if (uVar34 != 0) {
                    for (; (uVar34 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
                    }
                  }
                  auVar43._4_4_ = auVar40._8_4_;
                  auVar43._0_4_ = auVar40._8_4_;
                  auVar43._8_4_ = auVar40._8_4_;
                  auVar43._12_4_ = auVar40._8_4_;
                  auVar89 = blendvps(auVar80,auVar58,auVar43);
                  auVar63 = blendvps(auVar58,auVar80,auVar43);
                  auVar94._8_4_ = tNear.field_0.i[lVar20];
                  auVar94._0_8_ = *(undefined8 *)(uVar27 + lVar20 * 8);
                  auVar94._12_4_ = 0;
                  auVar44._8_4_ = -(uint)(iVar17 < tNear.field_0.i[lVar20]);
                  auVar44._4_4_ = auVar44._8_4_;
                  auVar44._0_4_ = auVar44._8_4_;
                  auVar44._12_4_ = auVar44._8_4_;
                  auVar92 = blendvps(auVar94,auVar67,auVar44);
                  auVar78 = blendvps(auVar67,auVar94,auVar44);
                  auVar45._8_4_ = -(uint)(auVar63._8_4_ < auVar78._8_4_);
                  auVar45._4_4_ = auVar45._8_4_;
                  auVar45._0_4_ = auVar45._8_4_;
                  auVar45._12_4_ = auVar45._8_4_;
                  auVar95 = blendvps(auVar78,auVar63,auVar45);
                  SVar59 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar63,auVar78,auVar45);
                  auVar46._8_4_ = -(uint)(auVar89._8_4_ < auVar92._8_4_);
                  auVar46._4_4_ = auVar46._8_4_;
                  auVar46._0_4_ = auVar46._8_4_;
                  auVar46._12_4_ = auVar46._8_4_;
                  auVar63 = blendvps(auVar92,auVar89,auVar46);
                  auVar78 = blendvps(auVar89,auVar92,auVar46);
                  auVar47._8_4_ = -(uint)(auVar78._8_4_ < auVar95._8_4_);
                  auVar47._4_4_ = auVar47._8_4_;
                  auVar47._0_4_ = auVar47._8_4_;
                  auVar47._12_4_ = auVar47._8_4_;
                  SVar68 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar95,auVar78,auVar47);
                  SVar90 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar78,auVar95,auVar47);
                  *pSVar32 = SVar59;
                  pSVar32[1] = SVar90;
                  pSVar32[2] = SVar68;
                  sVar33 = auVar63._0_8_;
                  pSVar32 = pSVar32 + 3;
                }
              }
            }
          }
        }
        else {
          iVar26 = 6;
        }
      } while (iVar26 == 0);
      if (iVar26 == 6) {
        (**(code **)((long)This->leafIntersector +
                    (ulong)*(byte *)(sVar33 & 0xfffffffffffffff0) * 0x40 + 0x10))(pre,ray,k,context)
        ;
        iVar51 = *(int *)(ray + k * 4 + 0x80);
        iVar52 = iVar51;
        iVar53 = iVar51;
        iVar54 = iVar51;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }